

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O1

void constructor(LexState *ls,expdesc *t)

{
  int iVar1;
  uint uVar2;
  FuncState *fs;
  int iVar3;
  int iVar4;
  uint uVar5;
  ConsControl cc;
  ConsControl local_60;
  
  fs = ls->fs;
  iVar4 = ls->linenumber;
  iVar3 = luaK_codeABC(fs,OP_NEWTABLE,0,0,0);
  local_60.tostore = 0;
  local_60.nh = 0;
  local_60.na = 0;
  t->t = -1;
  t->f = -1;
  t->k = VRELOCABLE;
  (t->u).s.info = iVar3;
  local_60.v.t = -1;
  local_60.v.f = -1;
  local_60.v.k = VVOID;
  local_60.v.u.s.info = 0;
  local_60.t = t;
  luaK_exp2nextreg(ls->fs,t);
  checknext(ls,0x7b);
  if ((ls->t).token != 0x7d) {
    do {
      if (local_60.v.k != VVOID) {
        luaK_exp2nextreg(fs,&local_60.v);
        local_60.v.k = VVOID;
        if (local_60.tostore == 0x32) {
          luaK_setlist(fs,((local_60.t)->u).s.info,local_60.na,0x32);
          local_60.tostore = 0;
        }
      }
      iVar1 = (ls->t).token;
      if (iVar1 == 0x5b) {
LAB_00110e79:
        recfield(ls,&local_60);
      }
      else {
        if (iVar1 == 0x11d) {
          luaX_lookahead(ls);
          if ((ls->lookahead).token == 0x3d) goto LAB_00110e79;
        }
        listfield(ls,&local_60);
      }
      if (((ls->t).token != 0x2c) && ((ls->t).token != 0x3b)) break;
      luaX_next(ls);
    } while ((ls->t).token != 0x7d);
  }
  check_match(ls,0x7d,0x7b,iVar4);
  if (local_60.tostore != 0) {
    if (local_60.v.k - VCALL < 2) {
      luaK_setreturns(fs,&local_60.v,-1);
      luaK_setlist(fs,((local_60.t)->u).s.info,local_60.na,-1);
      local_60.na = local_60.na - 1;
    }
    else {
      if (local_60.v.k != VVOID) {
        luaK_exp2nextreg(fs,&local_60.v);
      }
      luaK_setlist(fs,((local_60.t)->u).s.info,local_60.na,local_60.tostore);
    }
  }
  uVar2 = fs->f->code[iVar3];
  iVar4 = luaO_int2fb(local_60.na);
  fs->f->code[iVar3] = iVar4 << 0x17 | uVar2 & 0x7fffff;
  uVar5 = luaO_int2fb(local_60.nh);
  fs->f->code[iVar3] = (uVar5 & 0x1ff) << 0xe | iVar4 << 0x17 | uVar2 & 0x3fff;
  return;
}

Assistant:

static void constructor (LexState *ls, expdesc *t) {
  /* constructor -> ?? */
  FuncState *fs = ls->fs;
  int line = ls->linenumber;
  int pc = luaK_codeABC(fs, OP_NEWTABLE, 0, 0, 0);
  struct ConsControl cc;
  cc.na = cc.nh = cc.tostore = 0;
  cc.t = t;
  init_exp(t, VRELOCABLE, pc);
  init_exp(&cc.v, VVOID, 0);  /* no value (yet) */
  luaK_exp2nextreg(ls->fs, t);  /* fix it at stack top (for gc) */
  checknext(ls, '{');
  do {
    lua_assert(cc.v.k == VVOID || cc.tostore > 0);
    if (ls->t.token == '}') break;
    closelistfield(fs, &cc);
    switch(ls->t.token) {
      case TK_NAME: {  /* may be listfields or recfields */
        luaX_lookahead(ls);
        if (ls->lookahead.token != '=')  /* expression? */
          listfield(ls, &cc);
        else
          recfield(ls, &cc);
        break;
      }
      case '[': {  /* constructor_item -> recfield */
        recfield(ls, &cc);
        break;
      }
      default: {  /* constructor_part -> listfield */
        listfield(ls, &cc);
        break;
      }
    }
  } while (testnext(ls, ',') || testnext(ls, ';'));
  check_match(ls, '}', '{', line);
  lastlistfield(fs, &cc);
  SETARG_B(fs->f->code[pc], luaO_int2fb(cc.na)); /* set initial array size */
  SETARG_C(fs->f->code[pc], luaO_int2fb(cc.nh));  /* set initial table size */
}